

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,limb_type_conflict short_denominator,
          unsigned_fast_type u_offset,uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  bool bVar1;
  unsigned_short uVar2;
  iterator it;
  unsigned_short *x;
  reference pvVar3;
  const_iterator puVar4;
  undefined4 local_4a;
  undefined2 local_46;
  uint local_44;
  reverse_iterator<unsigned_short_*> local_40;
  reverse_iterator<unsigned_short_*> local_38;
  reverse_iterator ri;
  limb_type_conflict hi_part;
  double_limb_type long_numerator;
  uintwide_t<24U,_unsigned_char,_void,_false> *remainder_local;
  unsigned_fast_type u_offset_local;
  limb_type_conflict short_denominator_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  ri.current._4_4_ = 0;
  ri.current._2_2_ = 0;
  it = detail::array_detail::array<unsigned_short,_3UL>::begin((array<unsigned_short,_3UL> *)this);
  x = detail::advance_and_point<unsigned_short*,unsigned_int>(it,3 - (int)u_offset);
  detail::iterator_detail::reverse_iterator<unsigned_short_*>::reverse_iterator(&local_38,x);
  while( true ) {
    local_40.current =
         (unsigned_short *)
         detail::array_detail::array<unsigned_short,_3UL>::rend((array<unsigned_short,_3UL> *)this);
    bVar1 = detail::iterator_detail::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator*(&local_38);
    ri.current._4_4_ =
         (uint)*pvVar3 +
         (ri.current._4_4_ - (uint)short_denominator * (uint)ri.current._2_2_) * 0x10000;
    local_44 = ri.current._4_4_ / short_denominator;
    uVar2 = detail::make_lo<unsigned_short,unsigned_int>(&local_44);
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator*(&local_38);
    *pvVar3 = uVar2;
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator*(&local_38);
    ri.current._2_2_ = *pvVar3;
    detail::iterator_detail::reverse_iterator<unsigned_short_*>::operator++(&local_38);
  }
  if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
    puVar4 = detail::array_detail::array<unsigned_short,_3UL>::cbegin
                       ((array<unsigned_short,_3UL> *)this);
    ri.current._4_4_ =
         (uint)*puVar4 +
         (ri.current._4_4_ - (uint)short_denominator * (uint)ri.current._2_2_) * 0x10000;
    uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_short>(unsigned_short,std::
    enable_if<(std::is_integral<unsigned_short>::value&&std::is_unsigned<unsigned_short>::
    value)&&(std::numeric_limits<unsigned_short>::digits<=std::numeric_limits<unsigned_short>::
    digits),void>::type__
              (&local_4a,(unsigned_short)(ri.current._4_4_ >> 0x10),
               (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
                *)0x0);
    *(undefined4 *)remainder = local_4a;
    *(undefined2 *)(remainder[1].values.super_array<unsigned_char,_3UL>.elems + 1) = local_46;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }